

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void event_logv_(int severity,char *errstr,char *fmt,__va_list_tag *ap)

{
  size_t sVar1;
  char buf [1024];
  char local_418 [1032];
  
  if (event_debug_logging_mask_ != 0 || severity != 0) {
    if (fmt == (char *)0x0) {
      local_418[0] = '\0';
    }
    else {
      evutil_vsnprintf(local_418,0x400,fmt,ap);
    }
    if ((errstr != (char *)0x0) && (sVar1 = strlen(local_418), sVar1 < 0x3fd)) {
      evutil_snprintf(local_418 + sVar1,0x400 - sVar1,": %s",errstr);
    }
    if (log_fn == (event_log_cb)0x0) {
      event_logv__cold_1();
    }
    else {
      (*log_fn)(severity,local_418);
    }
  }
  return;
}

Assistant:

void
event_logv_(int severity, const char *errstr, const char *fmt, va_list ap)
{
	char buf[1024];
	size_t len;

	if (severity == EVENT_LOG_DEBUG && !event_debug_get_logging_mask_())
		return;

	if (fmt != NULL)
		evutil_vsnprintf(buf, sizeof(buf), fmt, ap);
	else
		buf[0] = '\0';

	if (errstr) {
		len = strlen(buf);
		if (len < sizeof(buf) - 3) {
			evutil_snprintf(buf + len, sizeof(buf) - len, ": %s", errstr);
		}
	}

	event_log(severity, buf);
}